

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::
LocalizerPass::handleCall(wasm::Expression*,wasm::HeapType_
          (void *this,Expression *call,HeapType type)

{
  size_type sVar1;
  Expression *replacement;
  undefined1 local_58 [8];
  ChildLocalizer localizer;
  HeapType type_local;
  
  localizer._40_8_ = type.id;
  sVar1 = std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(*(_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    **)((long)this + 0x130),(key_type *)&localizer.hasUnreachableChild);
  if (sVar1 != 0) {
    ChildLocalizer::ChildLocalizer
              ((ChildLocalizer *)local_58,call,*(Function **)((long)this + 0x120),
               *(Module **)((long)this + 0x128),(PassOptions *)(*(long *)((long)this + 8) + 0x30));
    replacement = ChildLocalizer::getReplacement((ChildLocalizer *)local_58);
    if (replacement != call) {
      if (*(Function **)((long)this + 0x120) != (Function *)0x0) {
        debuginfo::copyOriginalToReplacement
                  ((Expression *)**(undefined8 **)((long)this + 0x58),replacement,
                   *(Function **)((long)this + 0x120));
      }
      **(undefined8 **)((long)this + 0x58) = replacement;
      *(undefined1 *)((long)this + 0x138) = 1;
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               &localizer.wasm);
  }
  return;
}

Assistant:

void handleCall(Expression* call, HeapType type) {
      if (!callTargets.count(type)) {
        return;
      }

      ChildLocalizer localizer(
        call, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != call) {
        replaceCurrent(replacement);
        optimized = true;
      }
    }